

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pred.hpp
# Opt level: O3

AssertionResult *
iutest::AssertPred4Helper<bool(*)(int,int,int,int),int,int,int,int>
          (char *pred_str,char *expr1,char *expr2,char *expr3,char *expr4,
          _func_bool_int_int_int_int *pred,int val1,int val2,int val3,int val4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  AssertionResult *pAVar3;
  AssertionResult *in_RDI;
  int in_stack_00000028;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  AssertionResult local_40;
  
  cVar2 = (*(code *)expr3)((ulong)expr2 & 0xffffffff,(ulong)expr1 & 0xffffffff,
                           (ulong)pred_str & 0xffffffff,in_stack_00000028);
  if (cVar2 == '\0') {
    paVar1 = &local_40.m_message.field_2;
    local_40.m_message._M_string_length = 0;
    local_40.m_message.field_2._M_local_buf[0] = '\0';
    local_40.m_result = false;
    local_40.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar3 = AssertionResult::operator<<(&local_40,(char (*) [8])"error: ");
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_48);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x330a1c);
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_50);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x33001c);
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_58);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x33001c);
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_60);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x33001c);
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_68);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [29])") evaluates to false, where ");
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x326f26);
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_50);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [4])0x327cc3);
    pAVar3 = AssertionResult::operator<<(pAVar3,(int *)&expr2);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x326f26);
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_58);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [4])0x327cc3);
    pAVar3 = AssertionResult::operator<<(pAVar3,(int *)&expr1);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x326f26);
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_60);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [4])0x327cc3);
    pAVar3 = AssertionResult::operator<<(pAVar3,(int *)&pred_str);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x326f26);
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_68);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [4])0x327cc3);
    pAVar3 = AssertionResult::operator<<(pAVar3,&stack0x00000028);
    (in_RDI->m_message)._M_dataplus._M_p = (pointer)&(in_RDI->m_message).field_2;
    std::__cxx11::string::_M_construct<char*>();
    in_RDI->m_result = pAVar3->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_40.m_message._M_dataplus._M_p,
                      CONCAT71(local_40.m_message.field_2._M_allocated_capacity._1_7_,
                               local_40.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    (in_RDI->m_message)._M_dataplus._M_p = (pointer)&(in_RDI->m_message).field_2;
    (in_RDI->m_message)._M_string_length = 0;
    (in_RDI->m_message).field_2._M_local_buf[0] = '\0';
    in_RDI->m_result = true;
  }
  return in_RDI;
}

Assistant:

AssertionResult AssertPred4Helper(const char* pred_str
    , const char* expr1, const char* expr2, const char* expr3, const char* expr4
    , PRED pred, T1 val1, T2 val2, T3 val3, T4 val4)
{
    if IUTEST_COND_LIKELY( (*pred)(val1, val2, val3, val4) )
    {
        return AssertionSuccess();
    }
    return AssertionFailure() << "error: " << pred_str << "("
        << expr1 << ", " << expr2 << ", " << expr3 << ", " << expr4
        << ") evaluates to false, where "
        << "\n" << expr1 << " : " << val1
        << "\n" << expr2 << " : " << val2
        << "\n" << expr3 << " : " << val3
        << "\n" << expr4 << " : " << val4;
}